

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>::disposeImpl
          (DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_> *this,
          void *pointer)

{
  Array<capnp::word>::~Array
            ((Array<capnp::word> *)
             &this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>);
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }